

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::majorUpdateFtranFinal(HEkkDual *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  reference pvVar9;
  long in_RDI;
  HighsSimplexAnalysis *pHVar10;
  double pivotX2_1;
  double pivotX1_1;
  HighsInt pivotRow_1;
  MFinish *jFinish;
  HighsInt jFn_1;
  HVector *Row;
  HVector *Col;
  MFinish *finish;
  HighsInt iFn_1;
  double pivot_1;
  double pivot;
  double pivotX2;
  double pivotX1;
  double *pivotArray;
  double pivotAlpha;
  HighsInt pivotRow;
  HighsInt jFn;
  double *myRow;
  double *myCol;
  HighsInt iFn;
  HighsInt updateFTRAN_inDense;
  HighsSimplexAnalysis *in_stack_ffffffffffffff30;
  HighsInt in_stack_ffffffffffffff54;
  int iVar11;
  anon_class_24_3_5893e9c0 *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  long lVar12;
  undefined4 in_stack_ffffffffffffff70;
  int iVar13;
  double in_stack_ffffffffffffff78;
  HVectorBase<double> *in_stack_ffffffffffffff80;
  int local_24;
  int local_10;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffff30,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
  if (*(int *)(in_RDI + 0x728) < 0) {
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x14cc); local_10 = local_10 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + (long)local_10 * 0x78 + 0x2780) + 4) = 0xffffffff;
      *(undefined4 *)(*(long *)(in_RDI + (long)local_10 * 0x78 + 0x2778) + 4) = 0xffffffff;
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x792027);
      pdVar6 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x792059);
      for (local_24 = 0; local_24 < local_10; local_24 = local_24 + 1) {
        iVar13 = *(int *)(in_RDI + (long)local_24 * 0x78 + 0x2740);
        dVar1 = *(double *)(in_RDI + (long)local_24 * 0x78 + 0x2750);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x7920f1);
        dVar2 = pdVar5[iVar13];
        dVar3 = pdVar6[iVar13];
        if (1e-14 < ABS(dVar2)) {
          ::highs::parallel::for_each<HEkkDual::majorUpdateFtranFinal()::__0>
                    ((HighsInt)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                     (HighsInt)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff54);
          pdVar5[iVar13] = dVar2 / dVar1;
        }
        if (1e-14 < ABS(dVar3)) {
          ::highs::parallel::for_each<HEkkDual::majorUpdateFtranFinal()::__1>
                    ((HighsInt)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                     (HighsInt)in_stack_ffffffffffffff60,
                     (anon_class_24_3_5967739a *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54
                    );
          pdVar6[iVar13] = dVar3 / dVar1;
        }
      }
    }
  }
  else {
    for (iVar13 = 0; iVar13 < *(int *)(in_RDI + 0x14cc); iVar13 = iVar13 + 1) {
      lVar7 = in_RDI + 0x2718 + (long)iVar13 * 0x78;
      lVar12 = *(long *)(lVar7 + 0x68);
      lVar7 = *(long *)(lVar7 + 0x60);
      for (iVar11 = 0; iVar11 < iVar13; iVar11 = iVar11 + 1) {
        lVar8 = in_RDI + 0x2718 + (long)iVar11 * 0x78;
        iVar4 = *(int *)(lVar8 + 0x28);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar12 + 0x20),(long)iVar4);
        dVar1 = *pvVar9;
        if (1e-14 < ABS(dVar1)) {
          dVar2 = *(double *)(lVar8 + 0x38);
          HVectorBase<double>::saxpy<double,double>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (HVectorBase<double> *)CONCAT44(iVar13,in_stack_ffffffffffffff70));
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar12 + 0x20),(long)iVar4
                             );
          *pvVar9 = dVar1 / dVar2;
        }
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar7 + 0x20),(long)iVar4);
        in_stack_ffffffffffffff30 = (HighsSimplexAnalysis *)*pvVar9;
        if (1e-14 < ABS((double)in_stack_ffffffffffffff30)) {
          pHVar10 = (HighsSimplexAnalysis *)
                    ((double)in_stack_ffffffffffffff30 / *(double *)(lVar8 + 0x38));
          HVectorBase<double>::saxpy<double,double>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (HVectorBase<double> *)CONCAT44(iVar13,in_stack_ffffffffffffff70));
          in_stack_ffffffffffffff30 = pHVar10;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar7 + 0x20),(long)iVar4)
          ;
          *pvVar9 = (value_type)pHVar10;
        }
      }
    }
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffff30,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranFinal() {
  analysis->simplexTimerStart(FtranMixFinalClock);
  HighsInt updateFTRAN_inDense = dualRHS.workCount < 0;
  if (updateFTRAN_inDense) {
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      multi_finish[iFn].col_aq->count = -1;
      multi_finish[iFn].row_ep->count = -1;
      double* myCol = multi_finish[iFn].col_aq->array.data();
      double* myRow = multi_finish[iFn].row_ep->array.data();
      for (HighsInt jFn = 0; jFn < iFn; jFn++) {
        HighsInt pivotRow = multi_finish[jFn].row_out;
        const double pivotAlpha = multi_finish[jFn].alpha_row;
        const double* pivotArray = multi_finish[jFn].col_aq->array.data();
        double pivotX1 = myCol[pivotRow];
        double pivotX2 = myRow[pivotRow];

        // The FTRAN regular buffer
        if (fabs(pivotX1) > kHighsTiny) {
          const double pivot = pivotX1 / pivotAlpha;
          // #pragma omp parallel for
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt i = start; i < end; i++)
                  myCol[i] -= pivot * pivotArray[i];
              },
              100);
          myCol[pivotRow] = pivot;
        }
        // The FTRAN-DSE buffer
        if (fabs(pivotX2) > kHighsTiny) {
          const double pivot = pivotX2 / pivotAlpha;
          // #pragma omp parallel for
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt i = start; i < end; i++)
                  myRow[i] -= pivot * pivotArray[i];
              },
              100);
          myRow[pivotRow] = pivot;
        }
      }
    }
  } else {
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      MFinish* finish = &multi_finish[iFn];
      HVector* Col = finish->col_aq;
      HVector* Row = finish->row_ep;
      for (HighsInt jFn = 0; jFn < iFn; jFn++) {
        MFinish* jFinish = &multi_finish[jFn];
        HighsInt pivotRow = jFinish->row_out;
        double pivotX1 = Col->array[pivotRow];
        // The FTRAN regular buffer
        if (fabs(pivotX1) > kHighsTiny) {
          pivotX1 /= jFinish->alpha_row;
          Col->saxpy(-pivotX1, jFinish->col_aq);
          Col->array[pivotRow] = pivotX1;
        }
        // The FTRAN-DSE buffer
        double pivotX2 = Row->array[pivotRow];
        if (fabs(pivotX2) > kHighsTiny) {
          pivotX2 /= jFinish->alpha_row;
          Row->saxpy(-pivotX2, jFinish->col_aq);
          Row->array[pivotRow] = pivotX2;
        }
      }
    }
  }
  analysis->simplexTimerStop(FtranMixFinalClock);
}